

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-util.cc
# Opt level: O0

void wabt::interp::WriteTrap(Stream *stream,char *desc,Ptr *trap)

{
  Trap *this;
  undefined8 uVar1;
  string local_40;
  Ptr *local_20;
  Ptr *trap_local;
  char *desc_local;
  Stream *stream_local;
  
  local_20 = trap;
  trap_local = (Ptr *)desc;
  desc_local = (char *)stream;
  this = RefPtr<wabt::interp::Trap>::operator->(trap);
  Trap::message_abi_cxx11_(&local_40,this);
  uVar1 = std::__cxx11::string::c_str();
  Stream::Writef(stream,"%s: %s\n",desc,uVar1);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void WriteTrap(Stream* stream, const char* desc, const Trap::Ptr& trap) {
  stream->Writef("%s: %s\n", desc, trap->message().c_str());
}